

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSelect.c
# Opt level: O1

void If_ObjConePrint_rec(If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  void **ppvVar2;
  ulong uVar3;
  int iVar4;
  
  if ((pIfObj->CutBest).Area != 0.0) {
    return;
  }
  uVar1 = vVisited->nCap;
  if (vVisited->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar2;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_003a0143;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
      }
      vVisited->pArray = ppvVar2;
    }
    vVisited->nCap = iVar4;
  }
LAB_003a0143:
  iVar4 = vVisited->nSize;
  vVisited->nSize = iVar4 + 1;
  vVisited->pArray[iVar4] = &pIfObj->CutBest;
  (pIfObj->CutBest).Area = -NAN;
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) == (undefined1  [112])0x2) {
    return;
  }
  if (pIfObj->pEquiv != (If_Obj_t *)0x0) {
    If_ObjConePrint_rec(pIfMan,pIfObj->pEquiv,vVisited);
  }
  If_ObjConePrint_rec(pIfMan,pIfObj->pFanin0,vVisited);
  If_ObjConePrint_rec(pIfMan,pIfObj->pFanin1,vVisited);
  if (pIfObj->pEquiv == (If_Obj_t *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)(uint)pIfObj->pEquiv->Id;
  }
  printf("%5d = %5d & %5d | %5d\n",(ulong)(uint)pIfObj->Id,(ulong)(uint)pIfObj->pFanin0->Id,
         (ulong)(uint)pIfObj->pFanin1->Id,uVar3);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Prints the logic cone with choices.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void If_ObjConePrint_rec( If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    pCut = If_ObjCutBest(pIfObj);
    if ( If_CutDataInt(pCut) )
        return;
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return;
    // compute the functions of the children
    if ( pIfObj->pEquiv ) 
    If_ObjConePrint_rec( pIfMan, pIfObj->pEquiv, vVisited );
    If_ObjConePrint_rec( pIfMan, pIfObj->pFanin0, vVisited );
    If_ObjConePrint_rec( pIfMan, pIfObj->pFanin1, vVisited );
    printf( "%5d = %5d & %5d | %5d\n", pIfObj->Id, pIfObj->pFanin0->Id, pIfObj->pFanin1->Id, pIfObj->pEquiv ? pIfObj->pEquiv->Id : 0 );
}